

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::savedashbuffers(Forth *this)

{
  char cVar1;
  _Base_ptr p_Var2;
  string buffer;
  fstream f;
  char local_230 [16];
  int aiStack_220 [124];
  
  std::fstream::fstream(&f,(string *)&this->blockFileName,_S_out|_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    for (p_Var2 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (*(char *)((long)&p_Var2[1]._M_parent + 4) == '\x01') {
        std::istream::seekg((long)&f,(*(int *)&p_Var2[1].field_0x4 + -1) * 0x400);
        if (*(int *)((long)aiStack_220 + *(long *)(_f + -0x18)) == 0) {
          buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
          buffer._M_string_length = 0;
          buffer.field_2._M_local_buf[0] = '\0';
          moveFromDataSpace(this,&buffer,*(Cell *)&p_Var2[1]._M_parent,0x400);
          std::ostream::write(local_230,(long)buffer._M_dataplus._M_p);
          *(undefined1 *)((long)&p_Var2[1]._M_parent + 4) = 0;
          std::__cxx11::string::~string((string *)&buffer);
        }
      }
    }
  }
  std::fstream::~fstream(&f);
  return;
}

Assistant:

void savedashbuffers()
		{
			std::fstream f(blockFileName, std::ios_base::out | std::ios_base::in | std::ios_base::binary);
			if (f.is_open()) {
				for (auto& block : blocksInProcess) {
					if (block.second.blockModified) {
						f.seekg(static_cast<size_t>(block.second.blockNumber-1)*1024L, std::ios_base::beg);
						if (f.rdstate() == 0) {
							std::string buffer{};
							moveFromDataSpace(buffer, block.second.blockLocation, 1024);
							f.write(buffer.c_str(), buffer.size());
							auto statue = f.rdstate();
							auto length = f.gcount();
							statue = f.rdstate();
							block.second.blockModified = false;
						}
						auto statue = f.rdstate();
					}
				}
			}
		}